

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.hpp
# Opt level: O3

void CorUnix::CPalSynchronizationManager::ReleaseSharedSynchLock(CPalThread *pthrCurrent)

{
  if ((pthrCurrent->synchronizationInfo).m_lSharedSynchLockCount.m_val < 1) {
    fprintf(_stderr,"] %s %s:%d","ReleaseSharedSynchLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.hpp"
            ,0x2a4);
    fprintf(_stderr,"Expression: 0 < pthrCurrent->synchronizationInfo.m_lSharedSynchLockCount\n");
  }
  (pthrCurrent->synchronizationInfo).m_lSharedSynchLockCount.m_val =
       (pthrCurrent->synchronizationInfo).m_lSharedSynchLockCount.m_val + -1;
  if ((pthrCurrent->synchronizationInfo).m_lSharedSynchLockCount.m_val != 0) {
    return;
  }
  if ((pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount.m_val < 1) {
    fprintf(_stderr,"] %s %s:%d","ReleaseSharedSynchLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.hpp"
            ,0x2aa);
    fprintf(_stderr,
            "Expression: 0 < pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount, Description: Final release of the shared synch lock while not holding the local one. Local synch lock should always be acquired first and released last.\n"
           );
  }
  SHMRelease();
  return;
}

Assistant:

static void ReleaseSharedSynchLock(CPalThread * pthrCurrent) 
        {
            _ASSERTE(0 < pthrCurrent->synchronizationInfo.m_lSharedSynchLockCount);
            if (0 == --pthrCurrent->synchronizationInfo.m_lSharedSynchLockCount)
            {
                _ASSERT_MSG(0 < pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount,
                    "Final release of the shared synch lock while not holding the "
                    "local one. Local synch lock should always be acquired first and "
                    "released last.\n");                
                SHMRelease();
            }                
        }